

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O0

void __thiscall NetworkNS::cb3D_integrator::cell_density_nodal_points(cb3D_integrator *this)

{
  int iVar1;
  void *pvVar2;
  uint local_44;
  uint local_40;
  int i_1;
  uint inode;
  int i;
  int *hist_grid;
  double dStack_28;
  int Id;
  double znew;
  double ynew;
  double xnew;
  cb3D_integrator *this_local;
  
  xnew = (double)this;
  pvVar2 = malloc((long)this->cur_bd_net->grid->ncells << 2);
  for (i_1 = 0; i_1 < this->cur_bd_net->grid->ncells; i_1 = i_1 + 1) {
    *(undefined4 *)((long)pvVar2 + (long)i_1 * 4) = 0;
  }
  for (local_40 = 0; local_40 < this->dofs; local_40 = local_40 + 1) {
    ynew = this->bd_x[local_40 * 3];
    znew = this->bd_x[local_40 * 3 + 1];
    dStack_28 = this->bd_x[local_40 * 3 + 2];
    Domain::minimum_image(this->cur_bd_net->domain,&ynew,&znew,&stack0xffffffffffffffd8);
    ynew = ynew + this->cur_bd_net->domain->XBoxLen / 2.0;
    znew = znew + this->cur_bd_net->domain->YBoxLen / 2.0;
    dStack_28 = dStack_28 + this->cur_bd_net->domain->ZBoxLen / 2.0;
    iVar1 = Grid::find_grid_cell(this->cur_bd_net->grid,&ynew,&znew,&stack0xffffffffffffffd8);
    *(int *)((long)pvVar2 + (long)iVar1 * 4) = *(int *)((long)pvVar2 + (long)iVar1 * 4) + 1;
  }
  for (local_44 = 0; (int)local_44 < this->cur_bd_net->grid->ncells; local_44 = local_44 + 1) {
    fprintf((FILE *)this->p_cell_density,"%d  %d\n",(ulong)local_44,
            (ulong)*(uint *)((long)pvVar2 + (long)(int)local_44 * 4));
  }
  return;
}

Assistant:

void cb3D_integrator::cell_density_nodal_points() {

      double xnew, ynew, znew;
      int Id;
      int *hist_grid = (int*) malloc(cur_bd_net->grid->ncells * sizeof (int));

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         hist_grid[i] = 0;

      for (unsigned int inode = 0; inode < dofs; inode++) {

         xnew = bd_x[3 * inode + 0];
         ynew = bd_x[3 * inode + 1];
         znew = bd_x[3 * inode + 2];
         cur_bd_net->domain->minimum_image(xnew, ynew, znew);
         xnew = xnew + cur_bd_net->domain->XBoxLen / 2.0;
         ynew = ynew + cur_bd_net->domain->YBoxLen / 2.0;
         znew = znew + cur_bd_net->domain->ZBoxLen / 2.0;
         Id = cur_bd_net->grid->find_grid_cell(xnew, ynew, znew);
         hist_grid[Id] = hist_grid[Id] + 1;

      }

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         fprintf(p_cell_density, "%d " " %d\n", i, hist_grid[i]);

      return;
   }